

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Executor * __thiscall kj::EventLoop::getExecutor(EventLoop *this)

{
  Executor *pEVar1;
  undefined1 local_38 [8];
  ExecutorImpl *pEStack_30;
  Own<kj::Executor,_std::nullptr_t> local_28;
  
  pEVar1 = (this->executor).ptr.ptr;
  if (pEVar1 == (Executor *)0x0) {
    atomicRefcounted<kj::_::ExecutorImpl,kj::EventLoop&,kj::Badge<kj::EventLoop>>
              ((EventLoop *)local_38,(Badge<kj::EventLoop> *)this);
    local_28.disposer = (Disposer *)local_38;
    local_28.ptr = &pEStack_30->super_Executor;
    pEStack_30 = (ExecutorImpl *)0x0;
    Own<kj::Executor,_std::nullptr_t>::operator=(&(this->executor).ptr,&local_28);
    pEVar1 = (this->executor).ptr.ptr;
    Own<kj::Executor,_std::nullptr_t>::dispose(&local_28);
    Own<kj::_::ExecutorImpl,_std::nullptr_t>::dispose
              ((Own<kj::_::ExecutorImpl,_std::nullptr_t> *)local_38);
  }
  return pEVar1;
}

Assistant:

kj::String trace() {
    void* space[32]{};
    _::TraceBuilder builder(space);
    node->tracePromise(builder, false);
    return kj::str("task: ", builder);
  }